

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O3

unsigned_long dns(char *host_name)

{
  in_addr __in;
  hostent *phVar1;
  char *pcVar2;
  
  phVar1 = gethostbyname(host_name);
  if (phVar1 == (hostent *)0x0) {
    printf("[%s][%s(%d)]:gethostbyname %s failed\n","MSG_ERROR","dns",0x6d,host_name);
  }
  else if ((in_addr_t *)*phVar1->h_addr_list != (in_addr_t *)0x0) {
    __in.s_addr = *(in_addr_t *)*phVar1->h_addr_list;
    pcVar2 = inet_ntoa(__in);
    printf("[%s][%s(%d)]:%s address is %s\n","MSG_INFO","dns",0x75,host_name,pcVar2);
    return (ulong)__in.s_addr;
  }
  return 0xffffffffffffffff;
}

Assistant:

unsigned long dns(char *host_name) {
  struct hostent *host;
  struct in_addr addr;
  char **pp;

  host = gethostbyname(host_name);
  if (host == NULL) {
    lprintf(MSG_ERROR, "gethostbyname %s failed\n", host_name);
    return -1;
  }

  pp = host->h_addr_list;

  if (*pp != NULL) {
    addr.s_addr = *((unsigned int *)*pp);
    lprintf(MSG_INFO, "%s address is %s\n", host_name, inet_ntoa(addr));
    pp++;
    return addr.s_addr;
  }

  return -1;
}